

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O0

BasePropHandleT<char> __thiscall
OpenMesh::PropertyContainer::handle<char>(PropertyContainer *this,char *param_1,string *_name)

{
  bool bVar1;
  __type _Var2;
  reference ppBVar3;
  string *__lhs;
  const_reference ppBVar4;
  long local_58;
  __normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
  local_40;
  int local_34;
  const_iterator cStack_30;
  int idx;
  const_iterator p_it;
  string *_name_local;
  char *param_1_local;
  PropertyContainer *this_local;
  
  p_it._M_current = (BaseProperty **)_name;
  cStack_30 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::
              begin(&this->properties_);
  local_34 = 0;
  do {
    local_40._M_current =
         (BaseProperty **)
         std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::end
                   (&this->properties_);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffd0,&local_40);
    if (!bVar1) {
      BasePropHandleT<char>::BasePropHandleT((BasePropHandleT<char> *)((long)&this_local + 4),-1);
      return (BaseHandle)(BaseHandle)this_local._4_4_;
    }
    ppBVar3 = __gnu_cxx::
              __normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
              ::operator*(&stack0xffffffffffffffd0);
    if (*ppBVar3 != (BaseProperty *)0x0) {
      ppBVar3 = __gnu_cxx::
                __normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                ::operator*(&stack0xffffffffffffffd0);
      __lhs = BaseProperty::name_abi_cxx11_(*ppBVar3);
      _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)p_it._M_current);
      if (_Var2) {
        ppBVar4 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::
                  operator[](&this->properties_,(long)local_34);
        if (*ppBVar4 == (value_type)0x0) {
          local_58 = 0;
        }
        else {
          local_58 = __dynamic_cast(*ppBVar4,&BaseProperty::typeinfo,&PropertyT<char>::typeinfo,0);
        }
        if (local_58 != 0) {
          BasePropHandleT<char>::BasePropHandleT
                    ((BasePropHandleT<char> *)((long)&this_local + 4),local_34);
          return (BasePropHandleT<char>)(BaseHandle)this_local._4_4_;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
    ::operator++(&stack0xffffffffffffffd0);
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

BasePropHandleT<T> handle(const T&, const std::string& _name) const
  {
    Properties::const_iterator p_it = properties_.begin();
    for (int idx=0; p_it != properties_.end(); ++p_it, ++idx)
    {
      if (*p_it != NULL &&
         (*p_it)->name() == _name  //skip deleted properties
// Skip type check
#ifndef OM_FORCE_STATIC_CAST
          && dynamic_cast<PropertyT<T>*>(properties_[idx]) != NULL //check type
#endif
         )
      {
        return BasePropHandleT<T>(idx);
      }
    }
    return BasePropHandleT<T>();
  }